

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void djb::fresnel::f0_to_ior(value_type *f0,value_type *ior)

{
  float *pfVar1;
  size_t sVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  
  if (ior == (value_type *)0x0) {
    __assert_fail("ior && \"Null output ptr\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                  ,0x460,
                  "void djb::fresnel::f0_to_ior(const brdf::value_type &, brdf::value_type *)");
  }
  sVar2 = f0->_M_size;
  if (0 < (int)sVar2) {
    lVar3 = 0;
    do {
      pfVar1 = ior->_M_data;
      if (pfVar1 == (float *)0x0) {
        __assert_fail("ior && \"Null output ptr\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/demo-merl/dj_brdf.h"
                      ,0x454,"void djb::fresnel::f0_to_ior(float_t, float_t *)");
      }
      fVar5 = f0->_M_data[lVar3];
      fVar4 = 1.0;
      if ((fVar5 != 1.0) || (NAN(fVar5))) {
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        fVar4 = (fVar5 + 1.0) / (1.0 - fVar5);
        sVar2 = f0->_M_size;
      }
      pfVar1[lVar3] = fVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (int)sVar2);
  }
  return;
}

Assistant:

void f0_to_ior(const brdf::value_type& f0, brdf::value_type *ior)
{
	DJB_ASSERT(ior && "Null output ptr");
	for (int i = 0; i < (int)f0.size(); ++i)
		f0_to_ior(f0[i], &(*ior)[i]);
}